

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

void __thiscall
ON_BinaryArchive::EnableSave3dmRenderMeshes
          (ON_BinaryArchive *this,uint object_type_flags,bool bSave3dmRenderMeshes)

{
  undefined3 in_register_00000011;
  
  if (CONCAT31(in_register_00000011,bSave3dmRenderMeshes) != 0) {
    this->m_save_3dm_render_mesh_flags = this->m_save_3dm_render_mesh_flags | object_type_flags;
    return;
  }
  this->m_save_3dm_render_mesh_flags = this->m_save_3dm_render_mesh_flags & ~object_type_flags;
  return;
}

Assistant:

void ON_BinaryArchive::EnableSave3dmRenderMeshes(
  unsigned int object_type_flags,
  bool bSave3dmRenderMeshes 
  )
{
  if (bSave3dmRenderMeshes)
  {
    // set object type bits
    m_save_3dm_render_mesh_flags |= object_type_flags;
  }
  else
  {
    // clear object type bits
    unsigned int mask = ~object_type_flags;
    m_save_3dm_render_mesh_flags &= mask;
  }
}